

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string **p)

{
  bool bVar1;
  string *buffer;
  uint32 length;
  
  buffer = *p;
  if (buffer == (string *)&fixed_address_empty_string) {
    buffer = (string *)operator_new(0x20);
    (buffer->_M_dataplus)._M_p = (pointer)&buffer->field_2;
    buffer->_M_string_length = 0;
    (buffer->field_2)._M_local_buf[0] = '\0';
    *p = buffer;
  }
  bVar1 = io::CodedInputStream::ReadVarint32(input,&length);
  if (bVar1) {
    bVar1 = io::CodedInputStream::ReadString(input,buffer,length);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input, std::string** p) {
  if (*p == &GetEmptyStringAlreadyInited()) {
    *p = new std::string();
  }
  return ReadBytesToString(input, *p);
}